

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

int Nf_StoCellIsDominated(Mio_Cell2_t *pCell,int *pFans,word *pProf)

{
  int iVar1;
  int local_2c;
  int k;
  word *pProf_local;
  int *pFans_local;
  Mio_Cell2_t *pCell_local;
  
  if (pCell->Area < *pProf) {
    pCell_local._4_4_ = 0;
  }
  else {
    for (local_2c = 0; local_2c < (int)(*(uint *)&pCell->field_0x10 >> 0x1c);
        local_2c = local_2c + 1) {
      iVar1 = Abc_Lit2Var(pFans[local_2c]);
      if (pCell->Delays[iVar1] < pProf[local_2c + 1]) {
        return 0;
      }
    }
    pCell_local._4_4_ = 1;
  }
  return pCell_local._4_4_;
}

Assistant:

int Nf_StoCellIsDominated( Mio_Cell2_t * pCell, int * pFans, word * pProf )
{
    int k;
    if ( pCell->Area < pProf[0] )
        return 0;
    for ( k = 0; k < (int)pCell->nFanins; k++ )
        if ( pCell->Delays[Abc_Lit2Var(pFans[k])] < pProf[k+1] )
            return 0;
    return 1; // pCell is dominated
}